

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O2

uint attr_wrapper::get_attribute<unsigned_int>(Value *doc,char *name)

{
  uint uVar1;
  ConstMemberIterator CVar2;
  Type_error *__return_storage_ptr__;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  CVar2 = get_loc(doc,name);
  if ((((CVar2.ptr_)->value).flags_ & 0x800) != 0) {
    uVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(&(CVar2.ptr_)->value);
    return uVar1;
  }
  __return_storage_ptr__ = (Type_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,name,&local_59);
  std::__cxx11::string::string((string *)&local_58,"n unsigned integer.",&local_5a);
  genTypeError(__return_storage_ptr__,&local_38,&local_58);
  __cxa_throw(__return_storage_ptr__,&Type_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline unsigned get_attribute<unsigned>(const rapidjson::Value& doc,
                                           const char* name)
   {
      auto loc = get_loc(doc, name);
      if(!loc->value.IsUint())
      {
         throw genTypeError(name, "n unsigned integer.");
      }
      return loc->value.GetUint();
   }